

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer_e2e_test.cpp
# Opt level: O0

void peer_change_user_data(void)

{
  MinimalisticThreadInterface **this;
  WaitResult<bool> WVar1;
  FindUserDataCallable local_1b8;
  ushort local_18c;
  undefined1 local_18a;
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  FindUserDataCallable local_140;
  undefined2 local_114;
  undefined1 local_112;
  allocator local_111;
  string local_110 [4];
  WaitResult<bool> find;
  undefined1 local_f0 [8];
  FindUserDataCallable find_peer2;
  string local_c0 [32];
  undefined1 local_a0 [8];
  Peer peer2;
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  Peer peer1;
  PeerParameters peer_parameters;
  
  this = &peer1.receiving_thread_;
  udpdiscovery::PeerParameters::PeerParameters((PeerParameters *)this);
  udpdiscovery::PeerParameters::set_can_discover((PeerParameters *)this,true);
  udpdiscovery::PeerParameters::set_can_be_discovered((PeerParameters *)this,true);
  udpdiscovery::PeerParameters::set_port((PeerParameters *)this,0x2ef5);
  udpdiscovery::PeerParameters::set_application_id((PeerParameters *)this,0x753584);
  udpdiscovery::PeerParameters::set_send_timeout_ms((PeerParameters *)this,100);
  udpdiscovery::PeerParameters::set_multicast_group_address((PeerParameters *)this,0xe000007b);
  udpdiscovery::Peer::Peer((Peer *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"peer 1",&local_71);
  udpdiscovery::Peer::Start
            ((Peer *)local_50,(PeerParameters *)&peer1.receiving_thread_,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  udpdiscovery::impl::SleepFor(1000);
  udpdiscovery::Peer::Peer((Peer *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"peer 2",(allocator *)&find_peer2.field_0x27);
  udpdiscovery::Peer::Start
            ((Peer *)local_a0,(PeerParameters *)&peer1.receiving_thread_,(string *)local_c0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&find_peer2.field_0x27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"peer 2",&local_111);
  FindUserDataCallable::FindUserDataCallable
            ((FindUserDataCallable *)local_f0,(Peer *)local_50,(string *)local_110);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  FindUserDataCallable::FindUserDataCallable(&local_140,(FindUserDataCallable *)local_f0);
  WVar1 = Wait<bool,FindUserDataCallable>(5000,200,&local_140);
  local_114 = WVar1._0_2_;
  local_112 = WVar1.result;
  FindUserDataCallable::~FindUserDataCallable(&local_140);
  if ((local_114 & 1) != 0) {
    __assert_fail("find.is_timeout == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0xc4,"void peer_change_user_data()");
  }
  if ((local_114._1_1_ & 1) != 1) {
    __assert_fail("find.has_result == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0xc5,"void peer_change_user_data()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"peer 2 updated user data",&local_161);
  udpdiscovery::Peer::SetUserData((Peer *)local_a0,(string *)local_160);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"peer 2 updated user data",&local_189);
  FindUserDataCallable::SetUserData((FindUserDataCallable *)local_f0,(string *)local_188);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  FindUserDataCallable::FindUserDataCallable(&local_1b8,(FindUserDataCallable *)local_f0);
  WVar1 = Wait<bool,FindUserDataCallable>(5000,200,&local_1b8);
  local_18c = WVar1._0_2_;
  local_18a = WVar1.result;
  local_114 = local_18c;
  local_112 = local_18a;
  FindUserDataCallable::~FindUserDataCallable(&local_1b8);
  if ((local_114 & 1) != 0) {
    __assert_fail("find.is_timeout == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0xcc,"void peer_change_user_data()");
  }
  if ((local_114._1_1_ & 1) == 1) {
    udpdiscovery::Peer::StopAndWaitForThreads((Peer *)local_50);
    udpdiscovery::Peer::StopAndWaitForThreads((Peer *)local_a0);
    FindUserDataCallable::~FindUserDataCallable((FindUserDataCallable *)local_f0);
    udpdiscovery::Peer::~Peer((Peer *)local_a0);
    udpdiscovery::Peer::~Peer((Peer *)local_50);
    return;
  }
  __assert_fail("find.has_result == true",
                "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                ,0xcd,"void peer_change_user_data()");
}

Assistant:

void peer_change_user_data() {
  udpdiscovery::PeerParameters peer_parameters;
  peer_parameters.set_can_discover(true);
  peer_parameters.set_can_be_discovered(true);
  peer_parameters.set_port(kPort);
  peer_parameters.set_application_id(kApplicationId);
  peer_parameters.set_send_timeout_ms(100);
  peer_parameters.set_multicast_group_address(kMulticastAddress);

  udpdiscovery::Peer peer1;
  peer1.Start(peer_parameters, "peer 1");

  // TODO: Understand why do we need this timeout.
  udpdiscovery::impl::SleepFor(1000);

  udpdiscovery::Peer peer2;
  peer2.Start(peer_parameters, "peer 2");

  FindUserDataCallable find_peer2(peer1, "peer 2");
  WaitResult<bool> find =
      Wait<bool>(/* timeout = */ 5000, /* sleep_timeout = */ 200,
                 /* callable= */ find_peer2);
  assert(find.is_timeout == false);
  assert(find.has_result == true);

  peer2.SetUserData("peer 2 updated user data");

  find_peer2.SetUserData("peer 2 updated user data");
  find = Wait<bool>(/* timeout = */ 5000, /* sleep_timeout = */ 200,
                    /* callable= */ find_peer2);
  assert(find.is_timeout == false);
  assert(find.has_result == true);

  peer1.StopAndWaitForThreads();
  peer2.StopAndWaitForThreads();
}